

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void scalarmultiply(float32 **a,float32 x,int32 n)

{
  float32 *pfVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  float32 **ppfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
    lVar3 = 0;
    uVar4 = uVar2;
    ppfVar5 = a;
    uVar6 = 0;
    do {
      pfVar1 = a[uVar6];
      pfVar1[uVar6] = (float32)((float)pfVar1[uVar6] * (float)x);
      uVar7 = uVar6 + 1;
      if (uVar7 < uVar2) {
        uVar8 = 1;
        do {
          *(float *)((long)pfVar1 + uVar8 * 4 + lVar3) =
               *(float *)((long)pfVar1 + uVar8 * 4 + lVar3) * (float)x;
          ppfVar5[uVar8][uVar6] = (float32)((float)ppfVar5[uVar8][uVar6] * (float)x);
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      ppfVar5 = ppfVar5 + 1;
      lVar3 = lVar3 + 4;
      uVar4 = uVar4 - 1;
      uVar6 = uVar7;
    } while (uVar7 != uVar2);
  }
  return;
}

Assistant:

void
scalarmultiply(float32 ** a, float32 x, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i) {
	a[i][i] *= x;
        for (j = i+1; j < n; ++j) {
            a[i][j] *= x;
            a[j][i] *= x;
	}
    }
}